

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::InternalSwap
          (NonMaximumSuppression *this,NonMaximumSuppression *other)

{
  NonMaximumSuppression *other_local;
  NonMaximumSuppression *this_local;
  
  std::swap<std::__cxx11::string*>
            (&(this->confidenceinputfeaturename_).ptr_,&(other->confidenceinputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->coordinatesinputfeaturename_).ptr_,&(other->coordinatesinputfeaturename_).ptr_)
  ;
  std::swap<std::__cxx11::string*>
            (&(this->iouthresholdinputfeaturename_).ptr_,
             &(other->iouthresholdinputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->confidencethresholdinputfeaturename_).ptr_,
             &(other->confidencethresholdinputfeaturename_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->confidenceoutputfeaturename_).ptr_,&(other->confidenceoutputfeaturename_).ptr_)
  ;
  std::swap<std::__cxx11::string*>
            (&(this->coordinatesoutputfeaturename_).ptr_,
             &(other->coordinatesoutputfeaturename_).ptr_);
  std::swap<double>(&this->iouthreshold_,&other->iouthreshold_);
  std::swap<double>(&this->confidencethreshold_,&other->confidencethreshold_);
  std::swap<CoreML::Specification::NonMaximumSuppression::SuppressionMethodUnion>
            (&this->SuppressionMethod_,&other->SuppressionMethod_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<CoreML::Specification::NonMaximumSuppression::ClassLabelsUnion>
            (&this->ClassLabels_,&other->ClassLabels_);
  std::swap<unsigned_int>(this->_oneof_case_ + 1,other->_oneof_case_ + 1);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void NonMaximumSuppression::InternalSwap(NonMaximumSuppression* other) {
  confidenceinputfeaturename_.Swap(&other->confidenceinputfeaturename_);
  coordinatesinputfeaturename_.Swap(&other->coordinatesinputfeaturename_);
  iouthresholdinputfeaturename_.Swap(&other->iouthresholdinputfeaturename_);
  confidencethresholdinputfeaturename_.Swap(&other->confidencethresholdinputfeaturename_);
  confidenceoutputfeaturename_.Swap(&other->confidenceoutputfeaturename_);
  coordinatesoutputfeaturename_.Swap(&other->coordinatesoutputfeaturename_);
  std::swap(iouthreshold_, other->iouthreshold_);
  std::swap(confidencethreshold_, other->confidencethreshold_);
  std::swap(SuppressionMethod_, other->SuppressionMethod_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(ClassLabels_, other->ClassLabels_);
  std::swap(_oneof_case_[1], other->_oneof_case_[1]);
  std::swap(_cached_size_, other->_cached_size_);
}